

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_DecCreateCnf(Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,Vec_Wec_t *vGateCnfs)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Vec_Str_t *vCnf;
  char *pcVar3;
  Vec_Int_t *vCover;
  word Truth;
  void *__ptr;
  long lVar4;
  long lVar5;
  int iVar6;
  
  vCnf = (Vec_Str_t *)malloc(0x10);
  vCnf->nCap = 100;
  vCnf->nSize = 0;
  pcVar3 = (char *)malloc(100);
  vCnf->pArray = pcVar3;
  vCover = Vec_IntAlloc(100);
  lVar5 = 8;
  lVar4 = 0;
  while( true ) {
    if (vGateFuncs->nSize <= lVar4) {
      free(vCover->pArray);
      free(vCover);
      free(vCnf->pArray);
      free(vCnf);
      return;
    }
    Truth = Vec_WrdEntry(vGateFuncs,(int)lVar4);
    iVar2 = Vec_IntEntry(vGateSizes,(int)lVar4);
    Sfm_TruthToCnf(Truth,iVar2,vCover,vCnf);
    if (vGateCnfs->nSize <= lVar4) break;
    pVVar1 = vGateCnfs->pArray;
    iVar2 = vCnf->nSize;
    __ptr = *(void **)((long)&pVVar1->nCap + lVar5);
    iVar6 = iVar2;
    if (*(int *)((long)pVVar1 + lVar5 + -8) < iVar2) {
      if (__ptr == (void *)0x0) {
        __ptr = malloc((long)iVar2);
      }
      else {
        __ptr = realloc(__ptr,(long)iVar2);
        iVar6 = vCnf->nSize;
      }
      *(void **)((long)&pVVar1->nCap + lVar5) = __ptr;
      *(int *)((long)pVVar1 + lVar5 + -8) = iVar2;
    }
    memcpy(__ptr,vCnf->pArray,(long)iVar6);
    *(int *)((long)pVVar1 + lVar5 + -4) = vCnf->nSize;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Sfm_DecCreateCnf( Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs )
{
    Vec_Str_t * vCnf, * vCnfBase;
    Vec_Int_t * vCover;
    word uTruth;
    int i, nCubes;
    vCnf = Vec_StrAlloc( 100 );
    vCover = Vec_IntAlloc( 100 );
    Vec_WrdForEachEntry( vGateFuncs, uTruth, i )
    {
        nCubes = Sfm_TruthToCnf( uTruth, Vec_IntEntry(vGateSizes, i), vCover, vCnf );
        vCnfBase = (Vec_Str_t *)Vec_WecEntry( vGateCnfs, i );
        Vec_StrGrow( vCnfBase, Vec_StrSize(vCnf) );
        memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(vCnf), Vec_StrSize(vCnf) );
        vCnfBase->nSize = Vec_StrSize(vCnf);
    }
    Vec_IntFree( vCover );
    Vec_StrFree( vCnf );
}